

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

string * __thiscall
libcellml::ComponentEntity::encapsulationId_abi_cxx11_
          (string *__return_storage_ptr__,ComponentEntity *this)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = pEVar1[3].mId._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,sVar2,
             pEVar1[3].mId.field_2._M_allocated_capacity + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ComponentEntity::encapsulationId() const
{
    return pFunc()->mEncapsulationId;
}